

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcursor.cpp
# Opt level: O1

void QCursorData::initialize(void)

{
  QCursorData *pQVar1;
  QCursorData **ppQVar2;
  int shape;
  long lVar3;
  
  if (!initialized) {
    ppQVar2 = qt_cursorTable;
    lVar3 = 0;
    do {
      pQVar1 = (QCursorData *)operator_new(0x38);
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i = 1;
      pQVar1->cshape = (CursorShape)lVar3;
      pQVar1->bm = (QBitmap *)0x0;
      pQVar1->bmm = (QBitmap *)0x0;
      QPixmap::QPixmap(&pQVar1->pixmap);
      pQVar1->hx = 0;
      pQVar1->hy = 0;
      *ppQVar2 = pQVar1;
      lVar3 = lVar3 + 1;
      ppQVar2 = ppQVar2 + 1;
    } while (lVar3 != 0x16);
    initialized = true;
  }
  return;
}

Assistant:

void QCursorData::initialize()
{
    if (QCursorData::initialized)
        return;
    for (int shape = 0; shape <= Qt::LastCursor; ++shape)
        qt_cursorTable[shape] = new QCursorData((Qt::CursorShape)shape);
    QCursorData::initialized = true;
}